

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_error.cpp
# Opt level: O2

void ON_Error(char *sFileName,int line_number,char *sFormat,...)

{
  int iVar1;
  bool bPrint;
  char in_AL;
  char *description_00;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  ON_String description;
  char local_178 [24];
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  ON_ErrorEvent error_event;
  
  if (in_AL != '\0') {
    local_148 = in_XMM0_Qa;
    local_138 = in_XMM1_Qa;
    local_128 = in_XMM2_Qa;
    local_118 = in_XMM3_Qa;
    local_108 = in_XMM4_Qa;
    local_f8 = in_XMM5_Qa;
    local_e8 = in_XMM6_Qa;
    local_d8 = in_XMM7_Qa;
  }
  iVar1 = ON_ERROR_COUNT + 1;
  bPrint = ON_ERROR_COUNT < 0x20 && ON_DEBUG_ERROR_MESSAGE_OPTION != 0;
  ON_ERROR_COUNT = iVar1;
  if ((bPrint) || (ON_ACTIVE_ERROR_LOG != (ON_ErrorLog *)0x0)) {
    local_160 = in_RCX;
    local_158 = in_R8;
    local_150 = in_R9;
    ON_String::ON_String(&description);
    if ((sFormat != (char *)0x0) && (*sFormat != '\0')) {
      error_event.m_function_name = local_178;
      error_event.m_file_name = &stack0x00000008;
      error_event.m_event_type = 0x18;
      error_event.m_reserved1 = '\0';
      error_event.m_reserved2 = 0;
      error_event.m_line_number = 0x30;
      ON_String::FormatVargs(&description,sFormat,(__va_list_tag *)&error_event);
    }
    description_00 = ON_String::operator_cast_to_char_(&description);
    ON_ErrorEvent::ON_ErrorEvent
              (&error_event,Error,sFileName,line_number,(char *)0x0,description_00);
    ON_Internal_RecordErrorEvent(&error_event,bPrint);
    ON_String::~ON_String(&description);
  }
  return;
}

Assistant:

void ON_VARGS_FUNC_CDECL ON_Error(
  const char* sFileName, 
  int line_number,
  const char* sFormat,
  ...
)
{
  ON_IncrementErrorCount();

  const bool bPrintErrorMessage = ON_Internal_PrintErrorMessage();
  if ( bPrintErrorMessage || ON_Internal_LogError() )
  {
    ON_String description;
    if (sFormat && sFormat[0]) 
    {
      va_list args;
      va_start(args, sFormat);
      description.FormatVargs(sFormat, args);
      va_end(args);
    }

    const ON_ErrorEvent error_event(
      ON_ErrorEvent::Type::Error,
      sFileName,
      (unsigned int)line_number,
      nullptr,
      description
    );

    ON_Internal_RecordErrorEvent(error_event, bPrintErrorMessage);
  }

}